

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O2

int trust_compat(X509_TRUST *trust,X509 *x)

{
  int iVar1;
  
  iVar1 = x509v3_cache_extensions(x);
  if (iVar1 == 0) {
    iVar1 = 3;
  }
  else {
    iVar1 = (uint)((x->ex_flags & 0x2000) == 0) * 2 + 1;
  }
  return iVar1;
}

Assistant:

static int trust_compat(const X509_TRUST *trust, X509 *x) {
  if (!x509v3_cache_extensions(x)) {
    return X509_TRUST_UNTRUSTED;
  }
  if (x->ex_flags & EXFLAG_SS) {
    return X509_TRUST_TRUSTED;
  } else {
    return X509_TRUST_UNTRUSTED;
  }
}